

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileDescriptor *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar5;
  LogFinisher local_191;
  MutexLock lock;
  Printer printer;
  byte local_147;
  string filename;
  string module_name;
  FileDescriptorProto fdp;
  ZeroCopyOutputStream *pZVar4;
  
  lock.mu_ = &this->mutex_;
  google::protobuf::internal::Mutex::Lock();
  this->file_ = file;
  anon_unknown_0::ModuleName(&module_name,*(string **)file);
  std::__cxx11::string::string((string *)&filename,(string *)&module_name);
  google::protobuf::StripString((string *)&filename,".",'/');
  std::__cxx11::string::append((char *)&filename);
  google::protobuf::FileDescriptorProto::FileDescriptorProto(&fdp);
  google::protobuf::FileDescriptor::CopyTo((FileDescriptorProto *)this->file_);
  google::protobuf::MessageLite::SerializeToString((string *)&fdp);
  iVar3 = (*context->_vptr_GeneratorContext[2])(context,&filename);
  pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
  if (pZVar4 == (ZeroCopyOutputStream *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)&printer,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x10f);
    pLVar5 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)&printer,"CHECK failed: output.get(): ");
    google::protobuf::internal::LogFinisher::operator=(&local_191,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&printer);
  }
  google::protobuf::io::Printer::Printer(&printer,pZVar4,'$');
  this->printer_ = &printer;
  pFVar1 = this->file_;
  bVar2 = GeneratingDescriptorProto(this);
  google::protobuf::io::Printer::Print
            ((char *)&printer,
             "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\n",
             (string *)0x16e55b);
  if (0 < *(int *)(pFVar1 + 0x58)) {
    google::protobuf::io::Printer::Print((char *)&printer);
  }
  google::protobuf::io::Printer::Print((char *)&printer);
  if ((0 < *(int *)(pFVar1 + 0x68)) && (*(char *)(*(long *)(pFVar1 + 0x88) + 0x78) == '\x01')) {
    google::protobuf::io::Printer::Print((char *)&printer);
  }
  if (!bVar2) {
    google::protobuf::io::Printer::Print((char *)&printer);
  }
  google::protobuf::io::Printer::Print((char *)&printer);
  google::protobuf::io::Printer::Print((char *)&printer);
  PrintImports(this);
  PrintFileDescriptor(this);
  PrintTopLevelEnums(this);
  PrintTopLevelExtensions(this);
  PrintAllNestedEnumsInFile(this);
  PrintMessageDescriptors(this);
  FixForeignFieldsInDescriptors(this);
  PrintMessages(this);
  FixForeignFieldsInExtensions(this);
  FixAllDescriptorOptions(this);
  if ((0 < *(int *)(file + 0x68)) && (*(char *)(*(long *)(file + 0x88) + 0x78) == '\x01')) {
    PrintServices(this);
  }
  google::protobuf::io::Printer::Print((char *)&printer);
  google::protobuf::io::Printer::~Printer(&printer);
  if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
    (**(code **)(*(long *)pZVar4 + 8))(pZVar4);
  }
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(&fdp);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&module_name);
  internal::MutexLock::~MutexLock(&lock);
  return (bool)(local_147 ^ 1);
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const string& parameter,
                         GeneratorContext* context,
                         string* error) const {

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  string module_name = ModuleName(file->name());
  string filename = module_name;
  StripString(&filename, ".", '/');
  filename += ".py";

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  PrintImports();
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  PrintAllNestedEnumsInFile();
  PrintMessageDescriptors();
  FixForeignFieldsInDescriptors();
  PrintMessages();
  // We have to fix up the extensions after the message classes themselves,
  // since they need to call static RegisterExtension() methods on these
  // classes.
  FixForeignFieldsInExtensions();
  // Descriptor options may have custom extensions. These custom options
  // can only be successfully parsed after we register corresponding
  // extensions. Therefore we parse all options again here to recognize
  // custom options that may be unknown when we define the descriptors.
  FixAllDescriptorOptions();
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print(
    "# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}